

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ninja.cc
# Opt level: O0

int __thiscall
anon_unknown.dwarf_375::NinjaMain::ToolQuery(NinjaMain *this,Options *options,int argc,char **argv)

{
  const_iterator cVar1;
  bool bVar2;
  Node *this_00;
  undefined8 uVar3;
  Edge *this_01;
  size_type sVar4;
  reference ppNVar5;
  vector<Edge_*,_std::allocator<Edge_*>_> *pvVar6;
  reference ppEVar7;
  reference ppNVar8;
  __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_> local_b8;
  __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_> local_b0;
  iterator out;
  __normal_iterator<Edge_*const_*,_std::vector<Edge_*,_std::allocator<Edge_*>_>_> local_a0;
  const_iterator edge_1;
  char *label;
  int in;
  Edge *edge;
  Node *node;
  string err;
  undefined1 local_40 [4];
  int i;
  DyndepLoader dyndep_loader;
  char **argv_local;
  int argc_local;
  Options *options_local;
  NinjaMain *this_local;
  
  dyndep_loader.disk_interface_ = (DiskInterface *)argv;
  if (argc == 0) {
    Error("expected a target to query");
    this_local._4_4_ = 1;
  }
  else {
    DyndepLoader::DyndepLoader
              ((DyndepLoader *)local_40,&this->state_,&(this->disk_interface_).super_DiskInterface);
    for (err.field_2._12_4_ = 0; (int)err.field_2._12_4_ < argc;
        err.field_2._12_4_ = err.field_2._12_4_ + 1) {
      std::__cxx11::string::string((string *)&node);
      this_00 = CollectTarget(this,(char *)dyndep_loader.disk_interface_[(int)err.field_2._12_4_].
                                           super_FileReader._vptr_FileReader,(string *)&node);
      if (this_00 == (Node *)0x0) {
        uVar3 = std::__cxx11::string::c_str();
        Error("%s",uVar3);
        this_local._4_4_ = 1;
        bVar2 = true;
      }
      else {
        Node::path_abi_cxx11_(this_00);
        uVar3 = std::__cxx11::string::c_str();
        printf("%s:\n",uVar3);
        this_01 = Node::in_edge(this_00);
        if (this_01 != (Edge *)0x0) {
          if (((this_01->dyndep_ != (Node *)0x0) &&
              (bVar2 = Node::dyndep_pending(this_01->dyndep_), bVar2)) &&
             (bVar2 = DyndepLoader::LoadDyndeps
                                ((DyndepLoader *)local_40,this_01->dyndep_,(string *)&node), !bVar2)
             ) {
            uVar3 = std::__cxx11::string::c_str();
            Warning("%s\n",uVar3);
          }
          Rule::name_abi_cxx11_(this_01->rule_);
          uVar3 = std::__cxx11::string::c_str();
          printf("  input: %s\n",uVar3);
          for (label._4_4_ = 0;
              sVar4 = std::vector<Node_*,_std::allocator<Node_*>_>::size(&this_01->inputs_),
              label._4_4_ < (int)sVar4; label._4_4_ = label._4_4_ + 1) {
            edge_1._M_current = (Edge **)0x154e7e;
            bVar2 = Edge::is_implicit(this_01,(long)label._4_4_);
            if (bVar2) {
              edge_1._M_current = (Edge **)0x15096c;
            }
            else {
              bVar2 = Edge::is_order_only(this_01,(long)label._4_4_);
              if (bVar2) {
                edge_1._M_current = (Edge **)anon_var_dwarf_ede8;
              }
            }
            cVar1._M_current = edge_1._M_current;
            ppNVar5 = std::vector<Node_*,_std::allocator<Node_*>_>::operator[]
                                (&this_01->inputs_,(long)label._4_4_);
            Node::path_abi_cxx11_(*ppNVar5);
            uVar3 = std::__cxx11::string::c_str();
            printf("    %s%s\n",cVar1._M_current,uVar3);
          }
        }
        printf("  outputs:\n");
        pvVar6 = Node::out_edges(this_00);
        local_a0._M_current = (Edge **)std::vector<Edge_*,_std::allocator<Edge_*>_>::begin(pvVar6);
        while( true ) {
          pvVar6 = Node::out_edges(this_00);
          out._M_current = (Node **)std::vector<Edge_*,_std::allocator<Edge_*>_>::end(pvVar6);
          bVar2 = __gnu_cxx::operator!=
                            (&local_a0,
                             (__normal_iterator<Edge_*const_*,_std::vector<Edge_*,_std::allocator<Edge_*>_>_>
                              *)&out);
          if (!bVar2) break;
          ppEVar7 = __gnu_cxx::
                    __normal_iterator<Edge_*const_*,_std::vector<Edge_*,_std::allocator<Edge_*>_>_>
                    ::operator*(&local_a0);
          local_b0._M_current =
               (Node **)std::vector<Node_*,_std::allocator<Node_*>_>::begin(&(*ppEVar7)->outputs_);
          while( true ) {
            ppEVar7 = __gnu_cxx::
                      __normal_iterator<Edge_*const_*,_std::vector<Edge_*,_std::allocator<Edge_*>_>_>
                      ::operator*(&local_a0);
            local_b8._M_current =
                 (Node **)std::vector<Node_*,_std::allocator<Node_*>_>::end(&(*ppEVar7)->outputs_);
            bVar2 = __gnu_cxx::operator!=(&local_b0,&local_b8);
            if (!bVar2) break;
            ppNVar8 = __gnu_cxx::
                      __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
                      operator*(&local_b0);
            Node::path_abi_cxx11_(*ppNVar8);
            uVar3 = std::__cxx11::string::c_str();
            printf("    %s\n",uVar3);
            __gnu_cxx::__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
            operator++(&local_b0);
          }
          __gnu_cxx::__normal_iterator<Edge_*const_*,_std::vector<Edge_*,_std::allocator<Edge_*>_>_>
          ::operator++(&local_a0);
        }
        bVar2 = false;
      }
      std::__cxx11::string::~string((string *)&node);
      if (bVar2) {
        return this_local._4_4_;
      }
    }
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int NinjaMain::ToolQuery(const Options* options, int argc, char* argv[]) {
  if (argc == 0) {
    Error("expected a target to query");
    return 1;
  }

  DyndepLoader dyndep_loader(&state_, &disk_interface_);

  for (int i = 0; i < argc; ++i) {
    string err;
    Node* node = CollectTarget(argv[i], &err);
    if (!node) {
      Error("%s", err.c_str());
      return 1;
    }

    printf("%s:\n", node->path().c_str());
    if (Edge* edge = node->in_edge()) {
      if (edge->dyndep_ && edge->dyndep_->dyndep_pending()) {
        if (!dyndep_loader.LoadDyndeps(edge->dyndep_, &err)) {
          Warning("%s\n", err.c_str());
        }
      }
      printf("  input: %s\n", edge->rule_->name().c_str());
      for (int in = 0; in < (int)edge->inputs_.size(); in++) {
        const char* label = "";
        if (edge->is_implicit(in))
          label = "| ";
        else if (edge->is_order_only(in))
          label = "|| ";
        printf("    %s%s\n", label, edge->inputs_[in]->path().c_str());
      }
    }
    printf("  outputs:\n");
    for (vector<Edge*>::const_iterator edge = node->out_edges().begin();
         edge != node->out_edges().end(); ++edge) {
      for (vector<Node*>::iterator out = (*edge)->outputs_.begin();
           out != (*edge)->outputs_.end(); ++out) {
        printf("    %s\n", (*out)->path().c_str());
      }
    }
  }
  return 0;
}